

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderProgram.cpp
# Opt level: O0

void __thiscall
glu::ShaderProgram::ShaderProgram(ShaderProgram *this,Functions *gl,ProgramSources *sources)

{
  ShaderProgram *local_38;
  ProgramSources *sources_local;
  Functions *gl_local;
  ShaderProgram *this_local;
  
  local_38 = this;
  do {
    std::vector<glu::Shader_*,_std::allocator<glu::Shader_*>_>::vector(local_38->m_shaders);
    local_38 = (ShaderProgram *)(local_38->m_shaders + 1);
  } while (local_38 != (ShaderProgram *)&this->m_program);
  glu::Program::Program(&this->m_program,gl);
  init(this,(EVP_PKEY_CTX *)gl);
  return;
}

Assistant:

ShaderProgram::ShaderProgram (const glw::Functions& gl, const ProgramSources& sources)
	: m_program(gl)
{
	init(gl, sources);
}